

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

uint32_t __thiscall capnp::StructSchema::Field::getDefaultValueSchemaOffset(Field *this)

{
  uint32_t uVar1;
  bool bVar2;
  PointerReader local_68;
  StructReader local_40;
  
  bVar2 = (this->proto)._reader.pointerCount < 4;
  local_68.pointer = (this->proto)._reader.pointers + 3;
  if (bVar2) {
    local_68.pointer = (WirePointer *)0x0;
  }
  local_68.nestingLimit = (this->proto)._reader.nestingLimit;
  if (bVar2) {
    local_68.segment._0_4_ = 0;
    local_68.segment._4_4_ = 0;
    local_68.capTable._0_4_ = 0;
    local_68.capTable._4_4_ = 0;
    local_68.nestingLimit = 0x7fffffff;
  }
  else {
    local_68.segment._0_4_ = *(undefined4 *)&(this->proto)._reader.segment;
    local_68.segment._4_4_ = *(undefined4 *)((long)&(this->proto)._reader.segment + 4);
    local_68.capTable._0_4_ = *(undefined4 *)&(this->proto)._reader.capTable;
    local_68.capTable._4_4_ = *(undefined4 *)((long)&(this->proto)._reader.capTable + 4);
  }
  capnp::_::PointerReader::getStruct(&local_40,&local_68,(word *)0x0);
  uVar1 = Schema::getSchemaOffset((Schema *)this,(Reader *)&local_40);
  return uVar1;
}

Assistant:

uint32_t StructSchema::Field::getDefaultValueSchemaOffset() const {
  return parent.getSchemaOffset(proto.getSlot().getDefaultValue());
}